

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

iterator * __thiscall
QPDFNumberTreeObjectHelper::insert
          (iterator *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this,numtree_number key,
          QPDFObjectHandle *value)

{
  NNTreeImpl *this_00;
  iterator i;
  shared_ptr<NNTreeIterator> sStackY_b8;
  element_type *in_stack_ffffffffffffff58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  QPDFObjectHandle local_98;
  iterator local_88;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffff58);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff58,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
  NNTreeImpl::insert(&local_88,this_00,&local_98,(QPDFObjectHandle *)&stack0xffffffffffffff58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<NNTreeIterator,NNTreeIterator&>((NNTreeIterator *)&sStackY_b8);
  iterator::iterator(__return_storage_ptr__,&sStackY_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStackY_b8.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  NNTreeIterator::~NNTreeIterator(&local_88);
  return __return_storage_ptr__;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator
QPDFNumberTreeObjectHelper::insert(numtree_number key, QPDFObjectHandle value)
{
    auto i = m->impl->insert(QPDFObjectHandle::newInteger(key), value);
    return {std::make_shared<NNTreeIterator>(i)};
}